

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void show_topten(char *player,int top,int around,nh_bool own)

{
  nh_menuitem_conflict *pnVar1;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  int size;
  int icount;
  nh_menuitem *items;
  int listlen;
  int i;
  char buf [256];
  nh_topten_entry *scores;
  nh_bool own_local;
  int around_local;
  int top_local;
  char *player_local;
  
  items._0_4_ = 0;
  buf._248_8_ = nh_get_topten(&items,&listlen,player,top,around,(int)own);
  if ((int)items == 0) {
    curses_msgwin("There are no scores to show.");
  }
  else {
    wclear(_stdscr);
    wrefresh(_stdscr);
    _item_._4_4_ = 0;
    _item_._0_4_ = (int)items * 2 + 4;
    _size = (nh_menuitem_conflict *)malloc((long)(int)_item_ * 0x10c);
    if ((char)listlen != '\0') {
      if ((int)_item_ <= _item_._4_4_) {
        _item_._0_4_ = (int)_item_ << 1;
        _size = (nh_menuitem_conflict *)realloc(_size,(long)(int)_item_ * 0x10c);
      }
      pnVar1 = _size + _item_._4_4_;
      pnVar1->id = L'\0';
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,(char *)&listlen);
      _item_._4_4_ = _item_._4_4_ + 1;
      if ((int)_item_ <= _item_._4_4_) {
        _item_._0_4_ = (int)_item_ << 1;
        _size = (nh_menuitem_conflict *)realloc(_size,(long)(int)_item_ * 0x10c);
      }
      pnVar1 = _size + _item_._4_4_;
      pnVar1->id = L'\0';
      pnVar1->role = MI_TEXT;
      pnVar1->accel = '\0';
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,"");
      _item_._4_4_ = _item_._4_4_ + 1;
    }
    makeheader((char *)&listlen);
    if ((int)_item_ <= _item_._4_4_) {
      _item_._0_4_ = (int)_item_ << 1;
      _size = (nh_menuitem_conflict *)realloc(_size,(long)(int)_item_ * 0x10c);
    }
    pnVar1 = _size + _item_._4_4_;
    pnVar1->id = L'\0';
    pnVar1->role = MI_HEADING;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,(char *)&listlen);
    _item_._4_4_ = _item_._4_4_ + 1;
    for (items._4_4_ = 0; items._4_4_ < (int)items; items._4_4_ = items._4_4_ + 1) {
      topten_add_score((nh_topten_entry *)(buf._248_8_ + (long)items._4_4_ * 0x298),
                       (nh_menuitem **)&size,(int *)&_item_,(int *)((long)&_item_ + 4),_COLS + -4);
    }
    if ((int)_item_ <= _item_._4_4_) {
      _item_._0_4_ = (int)_item_ << 1;
      _size = (nh_menuitem_conflict *)realloc(_size,(long)(int)_item_ * 0x10c);
    }
    pnVar1 = _size + _item_._4_4_;
    pnVar1->id = L'\0';
    pnVar1->role = MI_TEXT;
    pnVar1->accel = '\0';
    pnVar1->group_accel = '\0';
    pnVar1->selected = '\0';
    strcpy(pnVar1->caption,"");
    _item_._4_4_ = _item_._4_4_ + L'\x01';
    curses_display_menu(_size,_item_._4_4_,"Top scores:",L'\0',(wchar_t *)0x0);
    free(_size);
  }
  return;
}

Assistant:

void show_topten(char *player, int top, int around, nh_bool own)
{
    struct nh_topten_entry *scores;
    char buf[BUFSZ];
    int i, listlen = 0;
    struct nh_menuitem *items;
    int icount, size;
    
    scores = nh_get_topten(&listlen, buf, player, top, around, own);
    
    if (listlen == 0) {
	curses_msgwin("There are no scores to show.");
	return;
    }
    
    /* show the score list on a blank screen */
    clear();
    refresh();

    icount = 0;
    size = 4 + listlen * 2; /* maximum length, only required if every item wraps */
    items = malloc(size * sizeof(struct nh_menuitem));
    
    /* buf has the topten status if there is one, eg:
     *  "you did not beat your previous score" */
    if (buf[0]) { 
	add_menu_txt(items, size, icount, buf, MI_TEXT);
	add_menu_txt(items, size, icount, "", MI_TEXT);
    }
    
    makeheader(buf);
    add_menu_txt(items, size, icount, buf, MI_HEADING);
    
    for (i = 0; i < listlen; i++)
	topten_add_score(&scores[i], &items, &size, &icount, COLS - 4);
    add_menu_txt(items, size, icount, "", MI_TEXT);
    
    curses_display_menu(items, icount, "Top scores:", PICK_NONE, NULL);
    free(items);
}